

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

int get_ext_key_name(char *namebuf,int c,int extc)

{
  int in_EDX;
  int in_ESI;
  char *in_RDI;
  int local_4;
  
  if ((in_ESI < 1) || (0x1b < in_ESI)) {
    if (in_ESI == 0) {
      if ((in_EDX < 1) || (0x21 < in_EDX)) {
        if ((in_EDX < 0x80) || (0x99 < in_EDX)) {
          strcpy(in_RDI,"[?]");
          local_4 = 0;
        }
        else {
          strcpy(in_RDI,"[alt-X]");
          in_RDI[5] = (char)in_EDX + -0x1f;
          local_4 = 1;
        }
      }
      else {
        strcpy(in_RDI,ext_key_names[in_EDX + -1]);
        local_4 = 1;
      }
    }
    else {
      *in_RDI = (char)in_ESI;
      in_RDI[1] = '\0';
      local_4 = 1;
    }
  }
  else {
    switch(in_ESI) {
    case 8:
      strcpy(in_RDI,"[bksp]");
      local_4 = 1;
      break;
    case 9:
      strcpy(in_RDI,"\\t");
      local_4 = 1;
      break;
    case 10:
    case 0xd:
      strcpy(in_RDI,"\\n");
      local_4 = 1;
      break;
    default:
      strcpy(in_RDI,"[ctrl-X]");
      in_RDI[6] = (char)in_ESI + '`';
      local_4 = 1;
      break;
    case 0x1b:
      strcpy(in_RDI,"[esc]");
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int get_ext_key_name(char *namebuf, int c, int extc)
{
    /* if it's a control character, translate it */
    if (c >= 1 && c <= 27)
    {
        switch(c)
        {
        case 10:
        case 13:
            /* return '\n' for LF and CR characters */
            strcpy(namebuf, "\\n");
            return TRUE;

        case 9:
            /* return '\t' for TAB characters */
            strcpy(namebuf, "\\t");
            return TRUE;

        case 8:
            /* return '[bksp]' for backspace characters */
            strcpy(namebuf, "[bksp]");
            return TRUE;

        case 27:
            /* return '[esc]' for the escape key */
            strcpy(namebuf, "[esc]");
            return TRUE;

        default:
            /* return '[ctrl-X]' for other control characters */
            strcpy(namebuf, "[ctrl-X]");
            namebuf[6] = (char)(c + 'a' - 1);
            return TRUE;
        }
    }

    /* if it's any other non-extended key, return it as-is */
    if (c != 0)
    {
        namebuf[0] = c;
        namebuf[1] = '\0';
        return TRUE;
    }
    
    /* if it's in the key name array, use the array entry */
    if (extc >= 1
        && extc <= (int)(sizeof(ext_key_names)/sizeof(ext_key_names[0])))
    {
        /* use the array name */
        strcpy(namebuf, ext_key_names[extc - 1]);
        return TRUE;
    }

    /* if it's in the ALT key range, generate an ALT key name */
    if (extc >= CMD_ALT && extc <= CMD_ALT + 25)
    {
        /* generate an ALT key name */
        strcpy(namebuf, "[alt-X]");
        namebuf[5] = (char)(extc - CMD_ALT + 'a');
        return TRUE;
    }

    /* it's not a valid key - use '[?]' as the name */
    strcpy(namebuf, "[?]");
    return FALSE;
}